

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaExist.c
# Opt level: O2

int Gia_ManQuantExist(Gia_Man_t *p0,int iLit,_func_int_void_ptr_int *pFuncCiToKeep,void *pData)

{
  int iVar1;
  Vec_Int_t *vQuantCis;
  Vec_Int_t *vQuantSide;
  Vec_Int_t *vQuantAnds;
  
  vQuantCis = Vec_IntAlloc(100);
  vQuantSide = Vec_IntAlloc(100);
  vQuantAnds = Vec_IntAlloc(100);
  iVar1 = Abc_Lit2Var(iLit);
  Gia_ManQuantCollect(p0,iVar1,pFuncCiToKeep,pData,vQuantCis,vQuantSide,vQuantAnds);
  iVar1 = Gia_ManQuantExistInt(p0,iLit,vQuantCis,vQuantSide,vQuantAnds);
  Vec_IntFree(vQuantCis);
  Vec_IntFree(vQuantSide);
  Vec_IntFree(vQuantAnds);
  return iVar1;
}

Assistant:

int Gia_ManQuantExist( Gia_Man_t * p0, int iLit, int(*pFuncCiToKeep)(void *, int), void * pData )
{
    int Res;
    Vec_Int_t * vQuantCis  = Vec_IntAlloc( 100 );
    Vec_Int_t * vQuantSide = Vec_IntAlloc( 100 );
    Vec_Int_t * vQuantAnds = Vec_IntAlloc( 100 );
    Gia_ManQuantCollect( p0, Abc_Lit2Var(iLit), pFuncCiToKeep, pData, vQuantCis, vQuantSide, vQuantAnds );
    Res = Gia_ManQuantExistInt( p0, iLit, vQuantCis, vQuantSide, vQuantAnds );
    Vec_IntFree( vQuantCis );
    Vec_IntFree( vQuantSide );
    Vec_IntFree( vQuantAnds );
    return Res;
}